

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionPrimitves.cpp
# Opt level: O2

void __thiscall
Kernel::SelectedLiteral::SelectedLiteral
          (SelectedLiteral *this,Clause *clause,uint litIdx,AlascaState *shared)

{
  this->cl = clause;
  this->litIdx = litIdx;
  InequalityNormalizer::tryNormalizeInterpreted
            (&this->interpreted,
             (shared->_normalizer).
             super___shared_ptr<Kernel::InequalityNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             clause->_literals[(int)litIdx]);
  return;
}

Assistant:

SelectedLiteral::SelectedLiteral(Clause* clause, unsigned litIdx, AlascaState& shared)
  : cl(clause)
  , litIdx(litIdx)
  , interpreted(shared.norm().tryNormalizeInterpreted(literal()))
{}